

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sys.c
# Opt level: O1

err_t cmdSysExePath(char *path,size_t *count)

{
  err_t eVar1;
  int iVar2;
  
  if (path == (char *)0x0) {
    path = (char *)0x0;
    iVar2 = 0;
  }
  else {
    if (*count == 0) {
      return 0x6e;
    }
    iVar2 = (int)*count + -1;
  }
  iVar2 = wai_getExecutablePath(path,iVar2,(int *)0x0);
  if (iVar2 < 0) {
    eVar1 = 0x65;
  }
  else {
    *count = (ulong)(iVar2 + 1);
    eVar1 = 0;
  }
  return eVar1;
}

Assistant:

err_t cmdSysExePath(char* path, size_t* count)
{
	int len;
	// pre
	ASSERT(memIsValid(count, O_PER_S));
	// определить длину пути
	if (!path)
	{
		len = wai_getExecutablePath(0, 0, 0);
		if (len < 0)
			return ERR_SYS;
		if (++len <= 0 || (int)(size_t)len != len)
			return ERR_OVERFLOW;
		*count = (size_t)len;
	}
	// определить путь
	else
	{
		ASSERT(memIsValid(path, *count));
		if (*count < 1)
			return ERR_OUTOFMEMORY;
		len = wai_getExecutablePath(path, (int)(*count - 1), 0);
		if (len < 0)
			return ERR_SYS;
		*count = (size_t)(len + 1);
	}
	return ERR_OK;
}